

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefile(cmLocalUnixMakefileGenerator3 *this)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  byte bVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  cmLocalUnixMakefileGenerator3 *pcVar9;
  bool bVar10;
  bool bVar11;
  Encoding encoding;
  int iVar12;
  _Rb_tree_node_base *p_Var13;
  bool bVar14;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  LocalObjectInfo *__range2;
  string ruleFileName;
  string ruleFileNameFull;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  cmGeneratedFileStream ruleFileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  _Rb_tree_node_base *local_350;
  _Rb_tree_node_base *local_348;
  cmLocalUnixMakefileGenerator3 *local_340;
  string local_338;
  string local_318;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  local_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined1 local_298 [616];
  
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Makefile","");
  ConvertToFullPath(&local_318,this,&local_338);
  encoding = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_318,false,encoding);
  if (((byte)(*(_func_int **)(local_298._0_8_ + -0x18))[(long)(local_298 + 0x20)] & 5) == 0) {
    bVar10 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (!bVar10) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
    }
    WriteLocalAllRules(this,(ostream *)local_298);
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2c8._M_impl.super__Rb_tree_header._M_header;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar10 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (bVar10) {
      cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)local_298,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2c8);
    }
    else {
      WriteLocalMakefileTargets
                (this,(ostream *)local_298,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2c8);
    }
    bVar10 = this->SkipPreprocessedSourceRules;
    bVar3 = this->SkipAssemblySourceRules;
    p_Var2 = &local_2f8._M_impl.super__Rb_tree_header;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_2f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    GetLocalObjectFiles(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                              *)&local_2f8);
    p_Var13 = local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
    pcVar9 = this;
    if ((_Rb_tree_header *)local_2f8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      do {
        local_340 = pcVar9;
        local_348 = p_Var13 + 1;
        local_350 = p_Var13 + 2;
        WriteObjectConvenienceRule
                  (this,(ostream *)local_298,"target to build an object file",(string *)local_348,
                   (LocalObjectInfo *)local_350);
        p_Var4 = p_Var13[2]._M_parent;
        if (*(_Base_ptr *)(p_Var13 + 2) == p_Var4) {
          bVar14 = true;
          bVar11 = true;
        }
        else {
          bVar6 = 0;
          p_Var5 = *(_Base_ptr *)(p_Var13 + 2);
          do {
            p_Var7 = p_Var5 + 1;
            pp_Var1 = &p_Var5->_M_parent;
            iVar12 = std::__cxx11::string::compare((char *)pp_Var1);
            if (((((iVar12 == 0) ||
                  (iVar12 = std::__cxx11::string::compare((char *)pp_Var1), iVar12 == 0)) ||
                 (iVar12 = std::__cxx11::string::compare((char *)pp_Var1), iVar12 == 0)) ||
                ((iVar12 = std::__cxx11::string::compare((char *)pp_Var1), iVar12 == 0 ||
                 (iVar12 = std::__cxx11::string::compare((char *)pp_Var1), iVar12 == 0)))) ||
               (iVar12 = std::__cxx11::string::compare((char *)pp_Var1), iVar12 == 0)) {
              bVar6 = 1;
              bVar11 = true;
            }
            else {
              bVar11 = false;
            }
          } while ((!bVar11) &&
                  (p_Var5 = (_Base_ptr)&p_Var7->_M_parent, (_Base_ptr)&p_Var7->_M_parent != p_Var4))
          ;
          bVar11 = (bool)(bVar6 ^ 1);
          bVar14 = (bool)(bVar6 ^ 1);
          this = local_340;
        }
        p_Var8 = local_348;
        if ((!bVar11) && (bVar10 == false)) {
          std::__cxx11::string::rfind((char *)local_348,0x6bb09d,0xffffffffffffffff);
          std::__cxx11::string::substr((ulong)&local_390,(ulong)p_Var8);
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_370,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          std::__cxx11::string::append((char *)&local_370);
          WriteObjectConvenienceRule
                    (this,(ostream *)local_298,"target to preprocess a source file",&local_370,
                     (LocalObjectInfo *)local_350);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          *(undefined1 *)((long)&p_Var13[2]._M_right + 1) = 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var8 = local_348;
        if (!bVar14 && (bVar3 & 1U) == 0) {
          std::__cxx11::string::rfind((char *)local_348,0x6bb09d,0xffffffffffffffff);
          std::__cxx11::string::substr((ulong)&local_390,(ulong)p_Var8);
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_370,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          std::__cxx11::string::append((char *)&local_370);
          WriteObjectConvenienceRule
                    (this,(ostream *)local_298,"target to generate assembly for a file",&local_370,
                     (LocalObjectInfo *)local_350);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          *(undefined1 *)((long)&p_Var13[2]._M_right + 2) = 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
        pcVar9 = local_340;
      } while ((_Rb_tree_header *)p_Var13 != &local_2f8._M_impl.super__Rb_tree_header);
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"help","");
    pVar15 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&local_2c8,&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      cmGlobalUnixMakefileGenerator3::WriteHelpRule
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)local_298,this);
    }
    WriteSpecialTargetsBottom(this,(ostream *)local_298);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::~_Rb_tree(&local_2f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2c8);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefile()
{
  // generate the includes
  std::string ruleFileName = "Makefile";

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  std::string ruleFileNameFull = this->ConvertToFullPath(ruleFileName);
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!ruleFileStream) {
    return;
  }
  // always write the top makefile
  if (!this->IsRootMakefile()) {
    ruleFileStream.SetCopyIfDifferent(true);
  }

  // write the all rules
  this->WriteLocalAllRules(ruleFileStream);

  // only write local targets unless at the top Keep track of targets already
  // listed.
  std::set<std::string> emittedTargets;
  if (!this->IsRootMakefile()) {
    // write our targets, and while doing it collect up the object
    // file rules
    this->WriteLocalMakefileTargets(ruleFileStream, emittedTargets);
  } else {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteConvenienceRules(ruleFileStream, emittedTargets);
  }

  bool do_preprocess_rules = this->GetCreatePreprocessedSourceRules();
  bool do_assembly_rules = this->GetCreateAssemblySourceRules();

  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);

  // now write out the object rules
  // for each object file name
  for (auto& localObjectFile : localObjectFiles) {
    // Add a convenience rule for building the object file.
    this->WriteObjectConvenienceRule(
      ruleFileStream, "target to build an object file", localObjectFile.first,
      localObjectFile.second);

    // Check whether preprocessing and assembly rules make sense.
    // They make sense only for C and C++ sources.
    bool lang_has_preprocessor = false;
    bool lang_has_assembly = false;

    for (LocalObjectEntry const& entry : localObjectFile.second) {
      if (entry.Language == "C" || entry.Language == "CXX" ||
          entry.Language == "CUDA" || entry.Language == "Fortran" ||
          entry.Language == "HIP" || entry.Language == "ISPC") {
        // Right now, C, C++, CUDA, Fortran, HIP and ISPC have both a
        // preprocessor and the ability to generate assembly code
        lang_has_preprocessor = true;
        lang_has_assembly = true;
        break;
      }
    }

    // Add convenience rules for preprocessed and assembly files.
    if (lang_has_preprocessor && do_preprocess_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(ruleFileStream,
                                       "target to preprocess a source file",
                                       (base + ".i"), localObjectFile.second);
      localObjectFile.second.HasPreprocessRule = true;
    }

    if (lang_has_assembly && do_assembly_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
        ruleFileStream, "target to generate assembly for a file",
        (base + ".s"), localObjectFile.second);
      localObjectFile.second.HasAssembleRule = true;
    }
  }

  // add a help target as long as there isn;t a real target named help
  if (emittedTargets.insert("help").second) {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteHelpRule(ruleFileStream, this);
  }

  this->WriteSpecialTargetsBottom(ruleFileStream);
}